

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurNormalBuffer<embree::Vec3fa>
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *normals_in,Transformations *spaces)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  float *pfVar2;
  Vector *pVVar3;
  float fVar4;
  pointer pvVar5;
  pointer pvVar6;
  size_t sVar7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar8;
  Vec3fa *pVVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  undefined1 auVar33 [16];
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  AffineSpace3ff space;
  
  pvVar5 = (normals_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (normals_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar6 == pvVar5) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector(__return_storage_ptr__,normals_in);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar7 = pvVar5->size_active;
    if ((long)pvVar6 - (long)pvVar5 == 0x20) {
      for (uVar21 = 0; uVar21 < (spaces->spaces).size_active; uVar21 = uVar21 + 1) {
        space.l.vy.field_0._8_8_ = 0;
        space.l.vx.field_0._8_8_ = 0;
        space.l.vy.field_0._0_8_ = 0;
        if (sVar7 != 0) {
          space.l.vy.field_0._8_8_ = alignedMalloc(sVar7 << 4,0x10);
          space.l.vy.field_0._0_8_ = sVar7;
        }
        lVar19 = 0;
        sVar20 = sVar7;
        while (bVar23 = sVar20 != 0, sVar20 = sVar20 - 1, bVar23) {
          pAVar8 = (spaces->spaces).items;
          pAVar1 = pAVar8 + uVar21;
          fVar24 = (pAVar1->l).vx.field_0.m128[0];
          fVar36 = (pAVar1->l).vx.field_0.m128[1];
          fVar4 = (pAVar1->l).vx.field_0.m128[2];
          pVVar3 = &pAVar8[uVar21].l.vy;
          fVar13 = (pVVar3->field_0).m128[0];
          fVar14 = (pVVar3->field_0).m128[1];
          fVar15 = (pVVar3->field_0).m128[2];
          pVVar3 = &pAVar8[uVar21].l.vz;
          fVar16 = (pVVar3->field_0).m128[0];
          fVar17 = (pVVar3->field_0).m128[1];
          fVar18 = (pVVar3->field_0).m128[2];
          pVVar9 = ((normals_in->
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->items;
          auVar31._0_4_ = fVar13 * fVar17 - fVar14 * fVar16;
          fVar34 = fVar14 * fVar18 - fVar15 * fVar17;
          fVar35 = fVar15 * fVar16 - fVar13 * fVar18;
          auVar31._4_4_ = fVar16 * fVar36 - fVar17 * fVar24;
          auVar31._8_4_ = fVar24 * fVar14 - fVar36 * fVar13;
          auVar31._12_4_ = 0;
          auVar28._4_4_ = fVar17 * fVar4 - fVar18 * fVar36;
          auVar28._0_4_ = fVar34;
          auVar28._8_4_ = fVar36 * fVar15 - fVar4 * fVar14;
          auVar28._12_4_ = 0;
          auVar25._4_4_ = fVar18 * fVar24 - fVar16 * fVar4;
          auVar25._0_4_ = fVar35;
          auVar25._8_4_ = fVar4 * fVar13 - fVar24 * fVar15;
          auVar25._12_4_ = 0;
          fVar24 = fVar4 * auVar31._0_4_ + fVar36 * fVar35 + fVar24 * fVar34;
          auVar10._4_4_ = fVar24;
          auVar10._0_4_ = fVar24;
          auVar10._8_4_ = fVar24;
          auVar10._12_4_ = fVar24;
          auVar29 = divps(auVar28,auVar10);
          auVar11._4_4_ = fVar24;
          auVar11._0_4_ = fVar24;
          auVar11._8_4_ = fVar24;
          auVar11._12_4_ = fVar24;
          auVar26 = divps(auVar25,auVar11);
          auVar12._4_4_ = fVar24;
          auVar12._0_4_ = fVar24;
          auVar12._8_4_ = fVar24;
          auVar12._12_4_ = fVar24;
          auVar32 = divps(auVar31,auVar12);
          fVar24 = *(float *)((long)&pVVar9->field_0 + lVar19);
          fVar36 = *(float *)((long)&pVVar9->field_0 + lVar19 + 4);
          fVar4 = *(float *)((long)&pVVar9->field_0 + lVar19 + 8);
          pfVar2 = (float *)(space.l.vy.field_0._8_8_ + lVar19);
          *pfVar2 = fVar4 * auVar29._8_4_ + fVar36 * auVar29._4_4_ + fVar24 * auVar29._0_4_;
          pfVar2[1] = fVar4 * auVar26._8_4_ + fVar36 * auVar26._4_4_ + fVar24 * auVar26._0_4_;
          pfVar2[2] = fVar4 * auVar32._8_4_ + fVar36 * auVar32._4_4_ + fVar24 * auVar32._0_4_;
          pfVar2[3] = fVar4 * 0.0 + fVar36 * 0.0 + fVar24 * 0.0;
          lVar19 = lVar19 + 0x10;
        }
        space.l.vx.field_0._8_8_ = space.l.vy.field_0._0_8_;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &space);
        alignedFree((void *)space.l.vy.field_0._8_8_);
      }
    }
    else {
      uVar21 = (long)pvVar6 - (long)pvVar5 >> 5;
      for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
        Transformations::interpolate(&space,spaces,(float)uVar22 / (float)(uVar21 - 1));
        local_98.items = (Vec3fa *)0x0;
        local_98.size_active = 0;
        local_98.size_alloced = 0;
        if (sVar7 != 0) {
          local_98.items = (Vec3fa *)alignedMalloc(sVar7 << 4,0x10);
          local_98.size_alloced = sVar7;
        }
        lVar19 = 0;
        sVar20 = sVar7;
        while (bVar23 = sVar20 != 0, sVar20 = sVar20 - 1, bVar23) {
          pVVar9 = (normals_in->
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar22].items;
          auVar33._0_4_ =
               space.l.vy.field_0.m128[0] * space.l.vz.field_0.m128[1] -
               space.l.vy.field_0.m128[1] * space.l.vz.field_0.m128[0];
          fVar24 = space.l.vy.field_0.m128[1] * space.l.vz.field_0.m128[2] -
                   space.l.vy.field_0.m128[2] * space.l.vz.field_0.m128[1];
          fVar36 = space.l.vy.field_0.m128[2] * space.l.vz.field_0.m128[0] -
                   space.l.vy.field_0.m128[0] * space.l.vz.field_0.m128[2];
          auVar33._4_4_ =
               space.l.vz.field_0.m128[0] * space.l.vx.field_0.m128[1] -
               space.l.vz.field_0.m128[1] * space.l.vx.field_0.m128[0];
          auVar33._8_4_ =
               space.l.vx.field_0.m128[0] * space.l.vy.field_0.m128[1] -
               space.l.vx.field_0.m128[1] * space.l.vy.field_0.m128[0];
          auVar33._12_4_ = 0;
          auVar30._4_4_ =
               space.l.vz.field_0.m128[1] * space.l.vx.field_0.m128[2] -
               space.l.vz.field_0.m128[2] * space.l.vx.field_0.m128[1];
          auVar30._0_4_ = fVar24;
          auVar30._8_4_ =
               space.l.vx.field_0.m128[1] * space.l.vy.field_0.m128[2] -
               space.l.vx.field_0.m128[2] * space.l.vy.field_0.m128[1];
          auVar30._12_4_ = 0;
          auVar27._4_4_ =
               space.l.vz.field_0.m128[2] * space.l.vx.field_0.m128[0] -
               space.l.vz.field_0.m128[0] * space.l.vx.field_0.m128[2];
          auVar27._0_4_ = fVar36;
          auVar27._8_4_ =
               space.l.vx.field_0.m128[2] * space.l.vy.field_0.m128[0] -
               space.l.vx.field_0.m128[0] * space.l.vy.field_0.m128[2];
          auVar27._12_4_ = 0;
          fVar24 = space.l.vx.field_0.m128[2] * auVar33._0_4_ +
                   space.l.vx.field_0.m128[1] * fVar36 + space.l.vx.field_0.m128[0] * fVar24;
          auVar26._4_4_ = fVar24;
          auVar26._0_4_ = fVar24;
          auVar26._8_4_ = fVar24;
          auVar26._12_4_ = fVar24;
          auVar30 = divps(auVar30,auVar26);
          auVar29._4_4_ = fVar24;
          auVar29._0_4_ = fVar24;
          auVar29._8_4_ = fVar24;
          auVar29._12_4_ = fVar24;
          auVar26 = divps(auVar27,auVar29);
          auVar32._4_4_ = fVar24;
          auVar32._0_4_ = fVar24;
          auVar32._8_4_ = fVar24;
          auVar32._12_4_ = fVar24;
          auVar29 = divps(auVar33,auVar32);
          fVar24 = *(float *)((long)&pVVar9->field_0 + lVar19);
          fVar36 = *(float *)((long)&pVVar9->field_0 + lVar19 + 4);
          fVar4 = *(float *)((long)&pVVar9->field_0 + lVar19 + 8);
          pfVar2 = (float *)((long)&(local_98.items)->field_0 + lVar19);
          *pfVar2 = fVar4 * auVar30._8_4_ + fVar36 * auVar30._4_4_ + fVar24 * auVar30._0_4_;
          pfVar2[1] = fVar4 * auVar26._8_4_ + fVar36 * auVar26._4_4_ + fVar24 * auVar26._0_4_;
          pfVar2[2] = fVar4 * auVar29._8_4_ + fVar36 * auVar29._4_4_ + fVar24 * auVar29._0_4_;
          pfVar2[3] = fVar4 * 0.0 + fVar36 * 0.0 + fVar24 * 0.0;
          lVar19 = lVar19 + 0x10;
        }
        local_98.size_active = local_98.size_alloced;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,&local_98);
        alignedFree(local_98.items);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurNormalBuffer(const std::vector<avector<Vertex>>& normals_in, const Transformations& spaces)
    {
      if (normals_in.size() == 0)
        return normals_in;
      
      std::vector<avector<Vertex>> normals_out;
      const size_t num_time_steps = normals_in.size();
      const size_t num_vertices = normals_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> norms(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            norms[j] = xfmNormal((AffineSpace3fa)spaces[i],normals_in[0][j]);
          }
          normals_out.push_back(std::move(norms));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> norms(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            norms[i] = xfmNormal ((AffineSpace3fa)space,normals_in[t][i]);
          }
          normals_out.push_back(std::move(norms));
        }
      }
      return normals_out;
    }